

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq.c
# Opt level: O3

int aq_add_frame(aq_t *q,mp3_frame_t *frame)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  dlist_t *dlist;
  bool bVar4;
  unsigned_long uVar5;
  void *__ptr;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  dlist_s *pdVar10;
  long lVar11;
  uchar *__dest;
  adu_t local_5e90;
  
  if (q == (aq_t *)0x0) {
    __assert_fail("q != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",
                  0x133,"int aq_add_frame(aq_t *, mp3_frame_t *)");
  }
  if (frame == (mp3_frame_t *)0x0) {
    __assert_fail("frame != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x134,
                  "int aq_add_frame(aq_t *, mp3_frame_t *)");
  }
  uVar1 = (frame->si).main_data_end;
  if (frame->frame_data_size + (long)(int)uVar1 < frame->adu_size) {
    aq_add_frame_cold_1();
    iVar6 = 0;
  }
  else {
    uVar5 = q->size;
    aq_enqueue_frame(q,frame);
    iVar6 = 0;
    if (((int)uVar1 <= (int)uVar5) && (iVar6 = 0, frame->adu_size <= q->size)) {
      pdVar10 = (q->frames).end;
      if (pdVar10 == (dlist_t *)0x0) {
        __assert_fail("dlist != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0xf5,
                      "void aq_make_adu(aq_t *)");
      }
      pvVar2 = pdVar10->data;
      if (pvVar2 == (void *)0x0) {
        __assert_fail("tail != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0xf7,
                      "void aq_make_adu(aq_t *)");
      }
      uVar1 = *(uint *)((long)pvVar2 + 0x10);
      memcpy(&local_5e90,pvVar2,0x5e60);
      lVar11 = 0;
      do {
        uVar8 = uVar1;
        if (uVar8 == 0) goto LAB_00102a62;
        pdVar10 = pdVar10->prev;
        if (pdVar10 == (dlist_s *)0x0) {
          __assert_fail("dlist != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x102,
                        "void aq_make_adu(aq_t *)");
        }
        if (pdVar10->data == (void *)0x0) {
          __assert_fail("prev_frame != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x104,
                        "void aq_make_adu(aq_t *)");
        }
        uVar3 = *(ulong *)((long)pdVar10->data + 0x4eb0);
        iVar6 = (int)uVar3;
        uVar1 = uVar8 - iVar6;
      } while (uVar3 < uVar8);
      lVar11 = (long)(int)(iVar6 - uVar8);
LAB_00102a62:
      while (dlist = (q->frames).dlist, dlist != pdVar10) {
        if (dlist == (dlist_t *)0x0) {
          __assert_fail("q->frames.dlist != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x9f,
                        "void aq_discard_top_frame(aq_t *)");
        }
        __ptr = dlist_get(&q->frames,dlist);
        if (__ptr == (void *)0x0) {
          __assert_fail("frame != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0xa1,
                        "void aq_discard_top_frame(aq_t *)");
        }
        q->size = q->size - *(long *)((long)__ptr + 0x4eb0);
        free(__ptr);
      }
      if (0 < *(int *)((long)pvVar2 + 0x4e80)) {
        __dest = local_5e90.raw + local_5e90.si_size + (ulong)(local_5e90.protected == '\0') * 2 + 4
        ;
        iVar6 = *(int *)((long)pvVar2 + 0x4e80);
        do {
          if (pdVar10 == (dlist_t *)0x0) {
            __assert_fail("dlist != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x116
                          ,"void aq_make_adu(aq_t *)");
          }
          pvVar2 = pdVar10->data;
          if (pvVar2 == (void *)0x0) {
            __assert_fail("f != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x118
                          ,"void aq_make_adu(aq_t *)");
          }
          iVar7 = *(int *)((long)pvVar2 + 0x4eb0) - (int)lVar11;
          if (iVar6 < iVar7) {
            iVar7 = iVar6;
          }
          memcpy(__dest,(void *)((long)pvVar2 +
                                lVar11 + *(long *)((long)pvVar2 + 0x4e68) +
                                         (ulong)(*(char *)((long)pvVar2 + 2) == '\0') * 2 + 0x4ec4),
                 (long)iVar7);
          __dest = __dest + iVar7;
          pdVar10 = pdVar10->next;
          lVar11 = 0;
          iVar9 = iVar6 - iVar7;
          bVar4 = iVar7 <= iVar6;
          iVar6 = iVar9;
        } while (iVar9 != 0 && bVar4);
      }
      aq_enqueue_adu(q,&local_5e90);
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

int aq_add_frame(aq_t *q, mp3_frame_t *frame) {
  assert(q != NULL);
  assert(frame != NULL);

  int back_ptr    = frame->si.main_data_end;
  int size_before = q->size;

  /* discard broken frames */
  if (frame->adu_size > (frame->frame_data_size + back_ptr)) {
    fprintf(stderr, "Broken frame, skipping...\n");
    return 0;
  }

  assert(frame->adu_size <= (frame->frame_data_size + back_ptr));
  
  aq_enqueue_frame(q, frame);

  if ((size_before < back_ptr) ||
      (q->size < frame->adu_size))
    return 0;

  aq_make_adu(q);
  return 1;
}